

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vcf.c
# Opt level: O0

void bcf_clear(bcf1_t *v)

{
  bcf_info_t *pbVar1;
  bcf_fmt_t *pbVar2;
  int local_14;
  int i;
  bcf1_t *v_local;
  
  for (local_14 = 0; local_14 < (v->d).m_info; local_14 = local_14 + 1) {
    if (*(int *)&(v->d).info[local_14].field_0x1c < 0) {
      free((v->d).info[local_14].vptr +
           -(long)(int)(*(uint *)&(v->d).info[local_14].field_0x1c & 0x7fffffff));
      pbVar1 = (v->d).info;
      *(uint *)&pbVar1[local_14].field_0x1c = *(uint *)&pbVar1[local_14].field_0x1c & 0x7fffffff;
    }
  }
  for (local_14 = 0; local_14 < (v->d).m_fmt; local_14 = local_14 + 1) {
    if (*(int *)&(v->d).fmt[local_14].field_0x1c < 0) {
      free((v->d).fmt[local_14].p +
           -(long)(int)(*(uint *)&(v->d).fmt[local_14].field_0x1c & 0x7fffffff));
      pbVar2 = (v->d).fmt;
      *(uint *)&pbVar2[local_14].field_0x1c = *(uint *)&pbVar2[local_14].field_0x1c & 0x7fffffff;
    }
  }
  v->unpacked = 0;
  v->rlen = 0;
  v->pos = 0;
  v->rid = 0;
  bcf_float_set(&v->qual,bcf_float_missing);
  *(ulong *)&v->field_0x10 = *(ulong *)&v->field_0x10 & 0xffffffffff;
  *(ulong *)&v->field_0x10 = *(ulong *)&v->field_0x10 & 0xffffff00ffffffff;
  *(ulong *)&v->field_0x10 = *(ulong *)&v->field_0x10 & 0xffffffff0000ffff;
  *(ulong *)&v->field_0x10 = *(ulong *)&v->field_0x10 & 0xffffffffffff0000;
  (v->indiv).l = 0;
  (v->shared).l = 0;
  (v->d).var_type = -1;
  (v->d).shared_dirty = 0;
  (v->d).indiv_dirty = 0;
  (v->d).n_flt = 0;
  v->errcode = 0;
  if ((v->d).m_als != 0) {
    *(v->d).als = '\0';
  }
  if ((v->d).m_id != 0) {
    *(v->d).id = '\0';
  }
  return;
}

Assistant:

void bcf_clear(bcf1_t *v)
{
    int i;
    for (i=0; i<v->d.m_info; i++)
    {
        if ( v->d.info[i].vptr_free )
        {
            free(v->d.info[i].vptr - v->d.info[i].vptr_off);
            v->d.info[i].vptr_free = 0;
        }
    }
    for (i=0; i<v->d.m_fmt; i++)
    {
        if ( v->d.fmt[i].p_free )
        {
            free(v->d.fmt[i].p - v->d.fmt[i].p_off);
            v->d.fmt[i].p_free = 0;
        }
    }
    v->rid = v->pos = v->rlen = v->unpacked = 0;
    bcf_float_set_missing(v->qual);
    v->n_info = v->n_allele = v->n_fmt = v->n_sample = 0;
    v->shared.l = v->indiv.l = 0;
    v->d.var_type = -1;
    v->d.shared_dirty = 0;
    v->d.indiv_dirty  = 0;
    v->d.n_flt = 0;
    v->errcode = 0;
    if (v->d.m_als) v->d.als[0] = 0;
    if (v->d.m_id) v->d.id[0] = 0;
}